

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::expansion::delete_expansion_on_heap(expansion *e)

{
  index_t capa;
  expansion *e_local;
  
  Process::acquire_spinlock(&expansions_lock);
  capa = capacity(e);
  bytes(capa);
  anon_unknown.dwarf_5292d::Pools::free((Pools *)::(anonymous_namespace)::pools_,e);
  Process::release_spinlock(&expansions_lock);
  return;
}

Assistant:

void expansion::delete_expansion_on_heap(expansion* e) {
	Process::acquire_spinlock(expansions_lock);	
        pools_.free(e, expansion::bytes(e->capacity()));
	Process::release_spinlock(expansions_lock);	
    }